

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O1

void __thiscall
nlohmann::json_abi_v3_12_0::detail::
serializer<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
::dump(serializer<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
       *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *val,bool pretty_print,bool ensure_ascii,uint indent_step,uint current_indent)

{
  value_t vVar1;
  _func_int **pp_Var2;
  binary_t *pbVar3;
  array_t *paVar4;
  ulong uVar5;
  _Rb_tree_node_base *p_Var6;
  undefined1 *puVar7;
  pointer pbVar8;
  _Base_ptr p_Var9;
  _func_int *UNRECOVERED_JUMPTABLE_00;
  pointer pbVar10;
  undefined8 uVar11;
  char *pcVar12;
  pointer pbVar13;
  pointer pcVar14;
  element_type *peVar15;
  uint uVar16;
  object_t *poVar17;
  const_iterator i_1;
  const_iterator i;
  ulong uVar19;
  _Rb_tree_header *p_Var18;
  
  vVar1 = (val->m_data).m_type;
  if (discarded < vVar1) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/build_O1/external-projects/src/externalJson/include/nlohmann/detail/output/serializer.hpp"
                  ,0x174,
                  "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  switch(vVar1) {
  case null:
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar15->_vptr_output_adapter_protocol[1];
    pcVar12 = "null";
    break;
  case object:
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pp_Var2 = peVar15->_vptr_output_adapter_protocol;
    if ((((val->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) {
      UNRECOVERED_JUMPTABLE_00 = pp_Var2[1];
      pcVar12 = "{}";
      goto LAB_00122a15;
    }
    if (pretty_print) {
      (*pp_Var2[1])(peVar15,"{\n",2);
      uVar16 = indent_step + current_indent;
      uVar5 = (ulong)uVar16;
      uVar19 = (this->indent_string)._M_string_length;
      if (uVar19 < uVar5) {
        std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar19 * '\x02');
      }
      poVar17 = (val->m_data).m_value.object;
      p_Var6 = (poVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((poVar17->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1) {
        uVar19 = 0;
        do {
          peVar15 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar15->_vptr_output_adapter_protocol[1])
                    (peVar15,(this->indent_string)._M_dataplus._M_p,uVar5);
          peVar15 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (**peVar15->_vptr_output_adapter_protocol)(peVar15,0x22);
          dump_escaped(this,(string_t *)(p_Var6 + 1),ensure_ascii);
          peVar15 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,"\": ",3);
          dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)(p_Var6 + 2),true,ensure_ascii,indent_step,uVar16);
          peVar15 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,",\n",2);
          uVar19 = uVar19 + 1;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
          poVar17 = (val->m_data).m_value.object;
        } while (uVar19 < (poVar17->_M_t)._M_impl.super__Rb_tree_header._M_node_count - 1);
      }
      p_Var18 = &(poVar17->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var6 == p_Var18) {
        __assert_fail("i != val.m_data.m_value.object->cend()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/build_O1/external-projects/src/externalJson/include/nlohmann/detail/output/serializer.hpp"
                      ,0x93,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      puVar7 = (undefined1 *)std::_Rb_tree_increment(p_Var6);
      if ((_Rb_tree_header *)puVar7 != p_Var18) {
        __assert_fail("std::next(i) == val.m_data.m_value.object->cend()",
                      "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/build_O1/external-projects/src/externalJson/include/nlohmann/detail/output/serializer.hpp"
                      ,0x94,
                      "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                     );
      }
      peVar15 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar15->_vptr_output_adapter_protocol[1])
                (peVar15,(this->indent_string)._M_dataplus._M_p,uVar5);
      peVar15 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (**peVar15->_vptr_output_adapter_protocol)(peVar15,0x22);
      dump_escaped(this,(string_t *)(p_Var6 + 1),ensure_ascii);
      peVar15 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,"\": ",3);
      dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)(p_Var6 + 2),true,ensure_ascii,indent_step,uVar16);
      peVar15 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (**peVar15->_vptr_output_adapter_protocol)(peVar15,10);
      peVar15 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      pcVar14 = (this->indent_string)._M_dataplus._M_p;
      goto LAB_00122c1d;
    }
    (**pp_Var2)(peVar15,0x7b);
    poVar17 = (val->m_data).m_value.object;
    p_Var9 = (poVar17->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((poVar17->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 1) {
      uVar19 = 0;
      do {
        peVar15 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar15->_vptr_output_adapter_protocol)(peVar15,0x22);
        dump_escaped(this,(string_t *)(p_Var9 + 1),ensure_ascii);
        peVar15 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,"\":",2);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)(p_Var9 + 2),false,ensure_ascii,indent_step,current_indent);
        peVar15 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar15->_vptr_output_adapter_protocol)(peVar15,0x2c);
        uVar19 = uVar19 + 1;
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        poVar17 = (val->m_data).m_value.object;
      } while (uVar19 < (poVar17->_M_t)._M_impl.super__Rb_tree_header._M_node_count - 1);
    }
    p_Var18 = &(poVar17->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 == p_Var18) {
      __assert_fail("i != val.m_data.m_value.object->cend()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/build_O1/external-projects/src/externalJson/include/nlohmann/detail/output/serializer.hpp"
                    ,0xaf,
                    "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    puVar7 = (undefined1 *)std::_Rb_tree_increment(p_Var9);
    if ((_Rb_tree_header *)puVar7 != p_Var18) {
      __assert_fail("std::next(i) == val.m_data.m_value.object->cend()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/build_O1/external-projects/src/externalJson/include/nlohmann/detail/output/serializer.hpp"
                    ,0xb0,
                    "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                   );
    }
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (**peVar15->_vptr_output_adapter_protocol)(peVar15,0x22);
    dump_escaped(this,(string_t *)(p_Var9 + 1),ensure_ascii);
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,"\":",2);
    dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               *)(p_Var9 + 2),false,ensure_ascii,indent_step,current_indent);
    goto LAB_00122c23;
  case array:
    paVar4 = (val->m_data).m_value.array;
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pp_Var2 = peVar15->_vptr_output_adapter_protocol;
    if ((paVar4->
        super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (paVar4->
        super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      if (pretty_print) {
        (*pp_Var2[1])(peVar15,"[\n",2);
        uVar16 = current_indent + indent_step;
        uVar5 = (ulong)uVar16;
        uVar19 = (this->indent_string)._M_string_length;
        if (uVar19 < uVar5) {
          std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar19 * '\x02');
        }
        paVar4 = (val->m_data).m_value.array;
        pbVar13 = (paVar4->
                  super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar8 = (paVar4->
                 super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pbVar13 != pbVar8 + -1) {
          do {
            peVar15 = (this->o).
                      super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (*peVar15->_vptr_output_adapter_protocol[1])
                      (peVar15,(this->indent_string)._M_dataplus._M_p,uVar5);
            dump(this,pbVar13,true,ensure_ascii,indent_step,uVar16);
            peVar15 = (this->o).
                      super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,",\n",2);
            pbVar13 = pbVar13 + 1;
            paVar4 = (val->m_data).m_value.array;
            pbVar8 = (paVar4->
                     super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          } while (pbVar13 != pbVar8 + -1);
        }
        if ((paVar4->
            super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            )._M_impl.super__Vector_impl_data._M_start == pbVar8) {
          __assert_fail("!val.m_data.m_value.array->empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/build_O1/external-projects/src/externalJson/include/nlohmann/detail/output/serializer.hpp"
                        ,0xd9,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        peVar15 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar15->_vptr_output_adapter_protocol[1])
                  (peVar15,(this->indent_string)._M_dataplus._M_p,uVar5);
        dump(this,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)(((val->m_data).m_value.string)->_M_string_length - 0x10),true,ensure_ascii,
             indent_step,uVar16);
        peVar15 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (**peVar15->_vptr_output_adapter_protocol)(peVar15,10);
        peVar15 = (this->o).
                  super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        (*peVar15->_vptr_output_adapter_protocol[1])
                  (peVar15,(this->indent_string)._M_dataplus._M_p,(ulong)current_indent);
      }
      else {
        (**pp_Var2)(peVar15,0x5b);
        paVar4 = (val->m_data).m_value.array;
        pbVar8 = (paVar4->
                 super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar10 = (paVar4->
                  super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        pbVar13 = pbVar10 + -1;
        if (pbVar8 != pbVar13) {
          do {
            dump(this,pbVar8,false,ensure_ascii,indent_step,current_indent);
            peVar15 = (this->o).
                      super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            (**peVar15->_vptr_output_adapter_protocol)(peVar15,0x2c);
            pbVar8 = pbVar8 + 1;
            paVar4 = (val->m_data).m_value.array;
            pbVar10 = (paVar4->
                      super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            pbVar13 = pbVar10 + -1;
          } while (pbVar8 != pbVar13);
        }
        if ((paVar4->
            super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
            )._M_impl.super__Vector_impl_data._M_start == pbVar10) {
          __assert_fail("!val.m_data.m_value.array->empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/build_O1/external-projects/src/externalJson/include/nlohmann/detail/output/serializer.hpp"
                        ,0xee,
                        "void nlohmann::detail::serializer<nlohmann::basic_json<>>::dump(const BasicJsonType &, const bool, const bool, const unsigned int, const unsigned int) [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        dump(this,pbVar13,false,ensure_ascii,indent_step,current_indent);
      }
      peVar15 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = *peVar15->_vptr_output_adapter_protocol;
      uVar11 = 0x5d;
      goto LAB_00122c31;
    }
    UNRECOVERED_JUMPTABLE_00 = pp_Var2[1];
    pcVar12 = "[]";
LAB_00122a15:
    uVar11 = 2;
    goto LAB_00122c57;
  case string:
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (**peVar15->_vptr_output_adapter_protocol)(peVar15,0x22);
    dump_escaped(this,(string_t *)(val->m_data).m_value.object,ensure_ascii);
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar15->_vptr_output_adapter_protocol;
    uVar11 = 0x22;
    goto LAB_00122c31;
  case boolean:
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar15->_vptr_output_adapter_protocol[1];
    if ((val->m_data).m_value.boolean != true) {
      pcVar12 = "false";
LAB_00122c52:
      uVar11 = 5;
      goto LAB_00122c57;
    }
    pcVar12 = "true";
    break;
  case number_integer:
    dump_integer<long,_0>(this,(val->m_data).m_value.number_integer);
    return;
  case number_unsigned:
    dump_integer<unsigned_long,_0>(this,(val->m_data).m_value.number_unsigned);
    return;
  case number_float:
    dump_float(this,(val->m_data).m_value.number_float);
    return;
  case binary:
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if (!pretty_print) {
      (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,"{\"bytes\":[",10);
      paVar4 = (val->m_data).m_value.array;
      pbVar13 = (paVar4->
                super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (pbVar13 !=
          (paVar4->
          super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        for (; pbVar8 = (pointer)(((val->m_data).m_value.string)->_M_string_length - 1),
            pbVar13 != pbVar8; pbVar13 = (pointer)&(pbVar13->m_data).field_0x1) {
          dump_integer<unsigned_char,_0>(this,(pbVar13->m_data).m_type);
          peVar15 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (**peVar15->_vptr_output_adapter_protocol)(peVar15,0x2c);
        }
        dump_integer<unsigned_char,_0>(this,(pbVar8->m_data).m_type);
      }
      peVar15 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,"],\"subtype\":",0xc);
      pbVar3 = (val->m_data).m_value.binary;
      if (pbVar3->m_has_subtype == true) {
        dump_integer<unsigned_long,_0>(this,pbVar3->m_subtype);
        goto LAB_00122c23;
      }
      peVar15 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      UNRECOVERED_JUMPTABLE_00 = peVar15->_vptr_output_adapter_protocol[1];
      pcVar12 = "null}";
      goto LAB_00122c52;
    }
    (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,"{\n",2);
    uVar5 = (ulong)(indent_step + current_indent);
    uVar19 = (this->indent_string)._M_string_length;
    if (uVar19 < uVar5) {
      std::__cxx11::string::resize((ulong)&this->indent_string,(char)uVar19 * '\x02');
    }
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar15->_vptr_output_adapter_protocol[1])
              (peVar15,(this->indent_string)._M_dataplus._M_p,uVar5);
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,"\"bytes\": [",10);
    paVar4 = (val->m_data).m_value.array;
    pbVar13 = (paVar4->
              super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar13 !=
        (paVar4->
        super__Vector_base<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_12_0::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_12_0::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pbVar8 = (pointer)(((val->m_data).m_value.string)->_M_string_length - 1);
      if (pbVar13 != pbVar8) {
        do {
          dump_integer<unsigned_char,_0>(this,(pbVar13->m_data).m_type);
          peVar15 = (this->o).
                    super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,", ",2);
          pbVar13 = (pointer)&(pbVar13->m_data).field_0x1;
          pbVar8 = (pointer)(((val->m_data).m_value.string)->_M_string_length - 1);
        } while (pbVar13 != pbVar8);
      }
      dump_integer<unsigned_char,_0>(this,(pbVar8->m_data).m_type);
    }
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,"],\n",3);
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar15->_vptr_output_adapter_protocol[1])
              (peVar15,(this->indent_string)._M_dataplus._M_p,uVar5);
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,"\"subtype\": ",0xb);
    pbVar3 = (val->m_data).m_value.binary;
    if (pbVar3->m_has_subtype == true) {
      dump_integer<unsigned_long,_0>(this,pbVar3->m_subtype);
    }
    else {
      peVar15 = (this->o).
                super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,"null",4);
    }
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    (**peVar15->_vptr_output_adapter_protocol)(peVar15,10);
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    pcVar14 = (this->indent_string)._M_dataplus._M_p;
LAB_00122c1d:
    (*peVar15->_vptr_output_adapter_protocol[1])(peVar15,pcVar14,(ulong)current_indent);
LAB_00122c23:
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = *peVar15->_vptr_output_adapter_protocol;
    uVar11 = 0x7d;
LAB_00122c31:
    (*UNRECOVERED_JUMPTABLE_00)(peVar15,uVar11);
    return;
  case discarded:
    peVar15 = (this->o).
              super___shared_ptr<nlohmann::json_abi_v3_12_0::detail::output_adapter_protocol<char>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    UNRECOVERED_JUMPTABLE_00 = peVar15->_vptr_output_adapter_protocol[1];
    pcVar12 = "<discarded>";
    uVar11 = 0xb;
    goto LAB_00122c57;
  }
  uVar11 = 4;
LAB_00122c57:
  (*UNRECOVERED_JUMPTABLE_00)(peVar15,pcVar12,uVar11);
  return;
}

Assistant:

void dump(const BasicJsonType& val,
              const bool pretty_print,
              const bool ensure_ascii,
              const unsigned int indent_step,
              const unsigned int current_indent = 0)
    {
        switch (val.m_data.m_type)
        {
            case value_t::object:
            {
                if (val.m_data.m_value.object->empty())
                {
                    o->write_characters("{}", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    auto i = val.m_data.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_data.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\": ", 3);
                        dump(i->second, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(i != val.m_data.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_data.m_value.object->cend());
                    o->write_characters(indent_string.c_str(), new_indent);
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\": ", 3);
                    dump(i->second, true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_character('{');

                    // first n-1 elements
                    auto i = val.m_data.m_value.object->cbegin();
                    for (std::size_t cnt = 0; cnt < val.m_data.m_value.object->size() - 1; ++cnt, ++i)
                    {
                        o->write_character('\"');
                        dump_escaped(i->first, ensure_ascii);
                        o->write_characters("\":", 2);
                        dump(i->second, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(i != val.m_data.m_value.object->cend());
                    JSON_ASSERT(std::next(i) == val.m_data.m_value.object->cend());
                    o->write_character('\"');
                    dump_escaped(i->first, ensure_ascii);
                    o->write_characters("\":", 2);
                    dump(i->second, false, ensure_ascii, indent_step, current_indent);

                    o->write_character('}');
                }

                return;
            }

            case value_t::array:
            {
                if (val.m_data.m_value.array->empty())
                {
                    o->write_characters("[]", 2);
                    return;
                }

                if (pretty_print)
                {
                    o->write_characters("[\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    // first n-1 elements
                    for (auto i = val.m_data.m_value.array->cbegin();
                            i != val.m_data.m_value.array->cend() - 1; ++i)
                    {
                        o->write_characters(indent_string.c_str(), new_indent);
                        dump(*i, true, ensure_ascii, indent_step, new_indent);
                        o->write_characters(",\n", 2);
                    }

                    // last element
                    JSON_ASSERT(!val.m_data.m_value.array->empty());
                    o->write_characters(indent_string.c_str(), new_indent);
                    dump(val.m_data.m_value.array->back(), true, ensure_ascii, indent_step, new_indent);

                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character(']');
                }
                else
                {
                    o->write_character('[');

                    // first n-1 elements
                    for (auto i = val.m_data.m_value.array->cbegin();
                            i != val.m_data.m_value.array->cend() - 1; ++i)
                    {
                        dump(*i, false, ensure_ascii, indent_step, current_indent);
                        o->write_character(',');
                    }

                    // last element
                    JSON_ASSERT(!val.m_data.m_value.array->empty());
                    dump(val.m_data.m_value.array->back(), false, ensure_ascii, indent_step, current_indent);

                    o->write_character(']');
                }

                return;
            }

            case value_t::string:
            {
                o->write_character('\"');
                dump_escaped(*val.m_data.m_value.string, ensure_ascii);
                o->write_character('\"');
                return;
            }

            case value_t::binary:
            {
                if (pretty_print)
                {
                    o->write_characters("{\n", 2);

                    // variable to hold indentation for recursive calls
                    const auto new_indent = current_indent + indent_step;
                    if (JSON_HEDLEY_UNLIKELY(indent_string.size() < new_indent))
                    {
                        indent_string.resize(indent_string.size() * 2, ' ');
                    }

                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"bytes\": [", 10);

                    if (!val.m_data.m_value.binary->empty())
                    {
                        for (auto i = val.m_data.m_value.binary->cbegin();
                                i != val.m_data.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_characters(", ", 2);
                        }
                        dump_integer(val.m_data.m_value.binary->back());
                    }

                    o->write_characters("],\n", 3);
                    o->write_characters(indent_string.c_str(), new_indent);

                    o->write_characters("\"subtype\": ", 11);
                    if (val.m_data.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_data.m_value.binary->subtype());
                    }
                    else
                    {
                        o->write_characters("null", 4);
                    }
                    o->write_character('\n');
                    o->write_characters(indent_string.c_str(), current_indent);
                    o->write_character('}');
                }
                else
                {
                    o->write_characters("{\"bytes\":[", 10);

                    if (!val.m_data.m_value.binary->empty())
                    {
                        for (auto i = val.m_data.m_value.binary->cbegin();
                                i != val.m_data.m_value.binary->cend() - 1; ++i)
                        {
                            dump_integer(*i);
                            o->write_character(',');
                        }
                        dump_integer(val.m_data.m_value.binary->back());
                    }

                    o->write_characters("],\"subtype\":", 12);
                    if (val.m_data.m_value.binary->has_subtype())
                    {
                        dump_integer(val.m_data.m_value.binary->subtype());
                        o->write_character('}');
                    }
                    else
                    {
                        o->write_characters("null}", 5);
                    }
                }
                return;
            }

            case value_t::boolean:
            {
                if (val.m_data.m_value.boolean)
                {
                    o->write_characters("true", 4);
                }
                else
                {
                    o->write_characters("false", 5);
                }
                return;
            }

            case value_t::number_integer:
            {
                dump_integer(val.m_data.m_value.number_integer);
                return;
            }

            case value_t::number_unsigned:
            {
                dump_integer(val.m_data.m_value.number_unsigned);
                return;
            }

            case value_t::number_float:
            {
                dump_float(val.m_data.m_value.number_float);
                return;
            }

            case value_t::discarded:
            {
                o->write_characters("<discarded>", 11);
                return;
            }

            case value_t::null:
            {
                o->write_characters("null", 4);
                return;
            }

            default:            // LCOV_EXCL_LINE
                JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert) LCOV_EXCL_LINE
        }
    }